

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O3

bool __thiscall OpenMD::SelectionCompiler::clauseOr(SelectionCompiler *this)

{
  pointer pTVar1;
  bool bVar2;
  Token tokenOr;
  Token TStack_48;
  
  bVar2 = clauseAnd(this);
  if (bVar2) {
    do {
      pTVar1 = (this->atokenInfix).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (this->itokenInfix ==
          ((long)(this->atokenInfix).
                 super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pTVar1 >> 3) * -0x5555555555555555) {
        return true;
      }
      if (pTVar1[this->itokenInfix].tok != 0x404) {
        return true;
      }
      tokenNext(&TStack_48,this);
      bVar2 = clauseAnd(this);
      if (bVar2) {
        std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
                  (&this->ltokenPostfix,&TStack_48);
      }
      if (TStack_48.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
        (*TStack_48.value._M_manager)(_Op_destroy,&TStack_48.value,(_Arg *)0x0);
      }
    } while (bVar2);
  }
  return false;
}

Assistant:

bool SelectionCompiler::clauseOr() {
    if (!clauseAnd()) { return false; }

    while (tokPeek() == Token::opOr) {
      Token tokenOr = tokenNext();
      if (!clauseAnd()) { return false; }
      addTokenToPostfix(tokenOr);
    }
    return true;
  }